

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O3

void __thiscall
Reset_printResetWithVariableAndTestVariable_Test::~Reset_printResetWithVariableAndTestVariable_Test
          (Reset_printResetWithVariableAndTestVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, printResetWithVariableAndTestVariable)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset variable=\"A\" test_variable=\"B\" order=\"1\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ResetPtr r = libcellml::Reset::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    v1->setName("A");
    v2->setName("B");

    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(1);
    c->addReset(r);

    libcellml::PrinterPtr p = libcellml::Printer::create();

    const std::string a = p->printModel(m);
    EXPECT_EQ(e, a);
}